

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O0

int NULLCTypeInfo::MemberCount(int *type)

{
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  ExternTypeInfo *exType;
  int *type_local;
  
  if (linker != 0) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),*type);
    if (pEVar1->subCat == CAT_CLASS) {
      type_local._4_4_ = (pEVar1->field_8).arrSize;
    }
    else {
      pcVar2 = FastVector<char,_false,_false>::operator[]
                         ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar1->offsetToName);
      nullcThrowError("typeid::memberCount: type (%s) is not a class",pcVar2);
      type_local._4_4_ = 0;
    }
    return type_local._4_4_;
  }
  __assert_fail("linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,0x11,"int NULLCTypeInfo::MemberCount(int *)");
}

Assistant:

int MemberCount(int* type)
	{
		assert(linker);
		ExternTypeInfo &exType = linker->exTypes[*type];
		if(exType.subCat != ExternTypeInfo::CAT_CLASS)
		{
			nullcThrowError("typeid::memberCount: type (%s) is not a class", &linker->exSymbols[exType.offsetToName]);
			return 0;
		}
		return exType.memberCount;
	}